

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

Value * __thiscall
vkt::shaderexecutor::DefaultSampling<tcu::Matrix<float,_2,_3>_>::genRandom
          (Value *__return_storage_ptr__,DefaultSampling<tcu::Matrix<float,_2,_3>_> *this,
          FloatFormat *fmt,Precision prec,Random *rnd)

{
  DefaultSampling<float> *pDVar1;
  float *pfVar2;
  float fVar3;
  undefined4 local_3c;
  undefined4 local_38;
  int colNdx;
  int rowNdx;
  Random *rnd_local;
  Precision prec_local;
  FloatFormat *fmt_local;
  DefaultSampling<tcu::Matrix<float,_2,_3>_> *this_local;
  Value *ret;
  
  tcu::Matrix<float,_2,_3>::Matrix(__return_storage_ptr__);
  for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
    for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
      pDVar1 = instance<vkt::shaderexecutor::DefaultSampling<float>>();
      fVar3 = (float)(**(code **)((long)*pDVar1 + 8))(pDVar1,fmt,prec,rnd);
      pfVar2 = tcu::Matrix<float,_2,_3>::operator()(__return_storage_ptr__,local_38,local_3c);
      *pfVar2 = fVar3;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Value	genRandom	(const FloatFormat& fmt, Precision prec, Random& rnd) const
	{
		Value ret;

		for (int rowNdx = 0; rowNdx < Rows; ++rowNdx)
			for (int colNdx = 0; colNdx < Columns; ++colNdx)
				ret(rowNdx, colNdx) = instance<DefaultSampling<T> >().genRandom(fmt, prec, rnd);

		return ret;
	}